

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::ElementUnsigned1
          (ByteCodeWriter *this,OpCode op,RegSlot Value,RegSlot Instance,uint32 Element)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_24;
  uint32 uStack_20;
  bool success;
  RegSlot local_1c;
  uint32 Element_local;
  RegSlot Instance_local;
  RegSlot Value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  uStack_20 = Element;
  local_1c = Instance;
  Element_local = Value;
  Instance_local._2_2_ = op;
  _Value_local = this;
  CheckOpen(this);
  op_00 = Instance_local._2_2_;
  OpLayoutType::OpLayoutType(&local_24,ElementUnsigned1);
  CheckOp(this,op_00,local_24);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(Instance_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5a1,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Element_local = ConsumeReg(this,Element_local);
  local_1c = ConsumeReg(this,local_1c);
  bVar2 = TryWriteElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,Instance_local._2_2_,Element_local,local_1c,uStack_20);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,Instance_local._2_2_,Element_local,local_1c,uStack_20), !bVar2)) &&
     (bVar2 = TryWriteElementUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,Instance_local._2_2_,Element_local,local_1c,uStack_20), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x5a6,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::ElementUnsigned1(OpCode op, RegSlot Value, RegSlot Instance, uint32 Element)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementUnsigned1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        Value = ConsumeReg(Value);
        Instance = ConsumeReg(Instance);

        MULTISIZE_LAYOUT_WRITE(ElementUnsigned1, op, Value, Instance, Element);
    }